

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_RSI;
  ostream_iterator<char,_char,_std::char_traits<char>_> *in_RDI;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_30;
  ostream_type *local_20;
  undefined4 local_18;
  int in_stack_ffffffffffffffec;
  
  std::ostream_iterator<char,_char,_std::char_traits<char>_>::ostream_iterator(&local_30,in_RSI);
  internal::
  format_decimal<char,std::ostream_iterator<char,char,std::char_traits<char>>,unsigned_long>
            (in_RDI,(unsigned_long)in_RSI,in_stack_ffffffffffffffec);
  in_RSI->_M_stream = local_20;
  in_RSI->_M_string = (char *)CONCAT44(in_stack_ffffffffffffffec,local_18);
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }